

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led.c
# Opt level: O0

int main(void)

{
  uint uVar1;
  long lVar2;
  int val;
  mraa_led_context led;
  mraa_result_t status;
  
  mraa_init();
  lVar2 = mraa_led_init(0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Failed to initialize LED\n");
    mraa_deinit();
  }
  else {
    uVar1 = mraa_led_read_max_brightness(lVar2);
    fprintf(_stdout,"maximum brightness value for LED is: %d\n",(ulong)uVar1);
    led._0_4_ = mraa_led_set_brightness(lVar2,(int)uVar1 < 1);
    if ((int)led == 0) {
      sleep(5);
      led._0_4_ = mraa_led_set_trigger(lVar2,"heartbeat");
      if ((int)led == 0) {
        fprintf(_stdout,"LED trigger set to: heartbeat\n");
        mraa_led_close(lVar2);
        mraa_deinit();
        return 0;
      }
      fprintf(_stderr,"unable to set LED trigger to: heartbeat\n");
    }
    else {
      fprintf(_stderr,"unable to set LED brightness\n");
    }
    mraa_result_print((int)led);
    mraa_deinit();
  }
  return 1;
}

Assistant:

int
main(void)
{
    mraa_result_t status = MRAA_SUCCESS;
    mraa_led_context led;
    int val;

    /* initialize mraa for the platform (not needed most of the time) */
    mraa_init();

    //! [Interesting]
    /* initialize LED */
    led = mraa_led_init(USER_LED);
    if (led == NULL) {
        fprintf(stderr, "Failed to initialize LED\n");
        mraa_deinit();
        return EXIT_FAILURE;
    }

    /* read maximum brightness */
    val = mraa_led_read_max_brightness(led);
    fprintf(stdout, "maximum brightness value for LED is: %d\n", val);
    if (val >= 1) {
        val = 0;
    } else {
        /* never reached mostly */
        val = 1;
    }

    /* turn LED on/off depending on max_brightness value */
    status = mraa_led_set_brightness(led, val);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "unable to set LED brightness\n");
        goto err_exit;
    }

    /* sleep for 5 seconds */
    sleep(5);

    /* set LED trigger to heartbeat */
    status = mraa_led_set_trigger(led, LED_TRIGGER);
    if (status != MRAA_SUCCESS) {
        fprintf(stderr, "unable to set LED trigger to: heartbeat\n");
        goto err_exit;
    }

    fprintf(stdout, "LED trigger set to: heartbeat\n");

    /* close LED */
    mraa_led_close(led);

    //! [Interesting]
    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_SUCCESS;

err_exit:
    mraa_result_print(status);

    /* deinitialize mraa for the platform (not needed most of the times) */
    mraa_deinit();

    return EXIT_FAILURE;
}